

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

bool __thiscall cmGlobalGenerator::GenerateCPackPropertiesFile(cmGlobalGenerator *this)

{
  cmake *pcVar1;
  pointer puVar2;
  cmMakefile *this_00;
  bool bVar3;
  string *psVar4;
  _Base_ptr p_Var5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  string path;
  string config;
  cmCPackPropertiesGenerator cpackPropertiesGenerator;
  cmGeneratedFileStream file;
  
  pcVar1 = this->CMakeInstance;
  puVar2 = (this->LocalGenerators).
           super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this_00 = *(cmMakefile **)
             ((long)(puVar2->_M_t).
                    super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>.
                    _M_t + 0x70);
  cmMakefile::GetGeneratorConfigs_abi_cxx11_(&configs,this_00,OnlyMultiConfig);
  cmMakefile::GetDefaultConfiguration_abi_cxx11_(&config,this_00);
  psVar4 = cmake::GetHomeOutputDirectory_abi_cxx11_(this->CMakeInstance);
  file.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
       (psVar4->_M_dataplus)._M_p;
  file.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)psVar4->_M_string_length;
  cpackPropertiesGenerator.super_cmScriptGenerator._vptr_cmScriptGenerator = (_func_int **)0x16;
  cpackPropertiesGenerator.super_cmScriptGenerator.RuntimeConfigVariable._M_dataplus._M_p =
       "/CPackProperties.cmake";
  cmStrCat<>(&path,(cmAlphaNum *)&file,(cmAlphaNum *)&cpackPropertiesGenerator);
  bVar3 = cmsys::SystemTools::FileExists(&path);
  if ((bVar3) || ((pcVar1->InstalledFiles)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
    cmGeneratedFileStream::cmGeneratedFileStream(&file,&path,false,None);
    std::operator<<((ostream *)&file,"# CPack properties\n");
    for (p_Var5 = (pcVar1->InstalledFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != &(pcVar1->InstalledFiles)._M_t._M_impl.super__Rb_tree_header;
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
      cmCPackPropertiesGenerator::cmCPackPropertiesGenerator
                (&cpackPropertiesGenerator,
                 (cmLocalGenerator *)
                 (puVar2->_M_t).
                 super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>.
                 _M_t,(cmInstalledFile *)(p_Var5 + 2),&configs);
      cmScriptGenerator::Generate
                (&cpackPropertiesGenerator.super_cmScriptGenerator,(ostream *)&file,&config,&configs
                );
      cmScriptGenerator::~cmScriptGenerator(&cpackPropertiesGenerator.super_cmScriptGenerator);
    }
    cmGeneratedFileStream::~cmGeneratedFileStream(&file);
  }
  std::__cxx11::string::~string((string *)&path);
  std::__cxx11::string::~string((string *)&config);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&configs);
  return true;
}

Assistant:

bool cmGlobalGenerator::GenerateCPackPropertiesFile()
{
  cmake::InstalledFilesMap const& installedFiles =
    this->CMakeInstance->GetInstalledFiles();

  const auto& lg = this->LocalGenerators[0];
  cmMakefile* mf = lg->GetMakefile();

  std::vector<std::string> configs =
    mf->GetGeneratorConfigs(cmMakefile::OnlyMultiConfig);
  std::string config = mf->GetDefaultConfiguration();

  std::string path = cmStrCat(this->CMakeInstance->GetHomeOutputDirectory(),
                              "/CPackProperties.cmake");

  if (!cmSystemTools::FileExists(path) && installedFiles.empty()) {
    return true;
  }

  cmGeneratedFileStream file(path);
  file << "# CPack properties\n";

  for (auto const& i : installedFiles) {
    cmInstalledFile const& installedFile = i.second;

    cmCPackPropertiesGenerator cpackPropertiesGenerator(
      lg.get(), installedFile, configs);

    cpackPropertiesGenerator.Generate(file, config, configs);
  }

  return true;
}